

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O2

bool proto2_unittest::Aggregate::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = *(uint *)&msg[1]._vptr_MessageLite;
  if ((uVar2 & 2) == 0) {
LAB_00a4aecb:
    if ((uVar2 & 4) != 0) {
      bVar1 = google::protobuf::FileOptions::IsInitializedImpl
                        ((MessageLite *)msg[2]._internal_metadata_.ptr_);
      if (!bVar1) goto LAB_00a4aef4;
      uVar2 = *(uint *)&msg[1]._vptr_MessageLite;
    }
    if ((uVar2 & 8) != 0) {
      bVar1 = AggregateMessageSet::IsInitializedImpl((MessageLite *)msg[3]._vptr_MessageLite);
      if (!bVar1) goto LAB_00a4aef4;
    }
    bVar1 = true;
  }
  else {
    bVar1 = IsInitializedImpl((MessageLite *)msg[2]._vptr_MessageLite);
    if (bVar1) {
      uVar2 = *(uint *)&msg[1]._vptr_MessageLite;
      goto LAB_00a4aecb;
    }
LAB_00a4aef4:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

PROTOBUF_NOINLINE bool Aggregate::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const Aggregate&>(msg);
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._impl_.sub_->IsInitialized()) return false;
  }
  if ((this_._impl_._has_bits_[0] & 0x00000004u) != 0) {
    if (!this_._impl_.file_->IsInitialized()) return false;
  }
  if ((this_._impl_._has_bits_[0] & 0x00000008u) != 0) {
    if (!this_._impl_.mset_->IsInitialized()) return false;
  }
  return true;
}